

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quote_collector.cpp
# Opt level: O0

void skiwi::collect_quotes(Program *prog,repl_data *data)

{
  bool bVar1;
  reference ppVar2;
  _Self local_100;
  _Self local_f8;
  undefined1 local_f0 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>
  q;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
  *__range1;
  undefined1 local_50 [8];
  quote_collector_visitor qcv;
  repl_data *data_local;
  Program *prog_local;
  
  qcv.collected_quotes._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)data;
  if (((prog->quotes_collected ^ 0xffU) & 1) != 0) {
    anon_unknown_2::quote_collector_visitor::quote_collector_visitor
              ((quote_collector_visitor *)local_50);
    visitor<skiwi::Program,_skiwi::(anonymous_namespace)::quote_collector_visitor>::visit
              (prog,(quote_collector_visitor *)local_50);
    prog->quotes_collected = true;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
    ::clear(&prog->quotes);
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
                      *)&qcv);
    q.second.vec.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
                  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
                         *)&qcv);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&q.second.vec.
                                                                                                          
                                                  super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                  ), bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>
               ::operator*(&__end1);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>
              *)local_f0,ppVar2);
      local_f8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)(qcv.collected_quotes._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18),
                  (key_type *)local_f0);
      local_100._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)(qcv.collected_quotes._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18));
      bVar1 = std::operator==(&local_f8,&local_100);
      if (bVar1) {
        std::
        map<std::__cxx11::string,skiwi::cell,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::cell>>>
        ::insert<std::pair<std::__cxx11::string_const,skiwi::cell>&>
                  ((map<std::__cxx11::string,skiwi::cell,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::cell>>>
                    *)&prog->quotes,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>
                    *)local_f0);
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>
               *)local_f0);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>
      ::operator++(&__end1);
    }
    anon_unknown_2::quote_collector_visitor::~quote_collector_visitor
              ((quote_collector_visitor *)local_50);
    return;
  }
  __assert_fail("!prog.quotes_collected",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/quote_collector.cpp"
                ,0x1d,"void skiwi::collect_quotes(Program &, repl_data &)");
}

Assistant:

void collect_quotes(Program& prog, repl_data& data)
  {
  assert(!prog.quotes_collected);
  quote_collector_visitor qcv;
  visitor<Program, quote_collector_visitor>::visit(prog, &qcv);  
  prog.quotes_collected = true;
  prog.quotes.clear();
  for (auto q : qcv.collected_quotes)
    {    
    if (data.quote_to_index.find(q.first) == data.quote_to_index.end())
      prog.quotes.insert(q);
    }  
  }